

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O3

void __thiscall test::spi_test::SPITest::FatalFailure_Sub(SPITest *this,int *count)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  TestPartResultReporterInterface *pTVar5;
  TestFlag TVar6;
  int iVar7;
  TestFlag *pTVar8;
  Variable *pVVar9;
  undefined **ppuVar10;
  int *in_R9;
  AssertionResult iutest_spi_ar_6;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_ar;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar;
  ScopedSPITestFlag guard_2;
  _Alloc_hider in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  char *local_288;
  undefined8 local_280;
  SPIFailureChecker local_278;
  SPITest *local_240;
  AssertionResult local_238;
  TestFlag local_210;
  allocator<char> local_209;
  undefined1 local_208 [128];
  ios_base local_188 [264];
  AssertionResult local_80;
  string local_58;
  int *local_38;
  
  local_240 = this;
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_003a5998;
  local_278.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_210);
  paVar1 = &local_238.m_message.field_2;
  local_238.m_message._M_string_length = 0;
  local_238.m_message.field_2._M_local_buf[0] = '\0';
  local_238.m_result = false;
  local_238.m_message._M_dataplus._M_p = (pointer)paVar1;
  memset((iu_global_format_stringstream *)local_208,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_208);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            (&local_58,(internal *)&local_238,(AssertionResult *)"false","false","true",
             (char *)in_R9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffd58,
             (char *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p),
             &local_209);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp";
  local_280._0_4_ = 0x1e;
  local_280._4_4_ = 2;
  iutest::AssertionHelper::OnFixed
            ((AssertionHelper *)&stack0xfffffffffffffd58,(Fixed *)local_208,false);
  local_38 = count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffd58._M_p != &local_298) {
    operator_delete(in_stack_fffffffffffffd58._M_p,local_298._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p) !=
      &local_58.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
  std::ios_base::~ios_base(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    CONCAT71(local_238.m_message.field_2._M_allocated_capacity._1_7_,
                             local_238.m_message.field_2._M_local_buf[0]) + 1);
  }
  TVar6.m_test_flags = local_210.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar6.m_test_flags;
  pcVar2 = local_208 + 0x10;
  local_208._8_8_ = 0;
  local_208[0x10] = '\0';
  local_208._0_8_ = pcVar2;
  iutest::detail::SPIFailureChecker::GetResult(&local_80,&local_278,(string *)local_208);
  if ((pointer)local_208._0_8_ != pcVar2) {
    operator_delete((void *)local_208._0_8_,CONCAT71(local_208._17_7_,local_208[0x10]) + 1);
  }
  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_003a5a08;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar5 = local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_003a2e10;
  pVVar9 = iutest::TestEnv::get_vars();
  bVar4 = local_80.m_result;
  pVVar9->m_testpartresult_reporter = pTVar5;
  if (local_80.m_result == false) {
    memset((iu_global_format_stringstream *)local_208,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,local_80.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd58);
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x337568;
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x20000001e;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_208,false);
    if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
    std::ios_base::~ios_base(local_188);
  }
  paVar3 = &local_80.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 != false) {
    iutest::detail::NewTestPartResultCheckHelper::
    Collector<iutest::detail::NoTestPartResultReporter>::Collector
              (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>);
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
    super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (TestPartResultReporterInterface)&PTR__Collector_003a5998;
    local_278.m_Type = kFatalFailure;
    iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_210);
    local_238.m_message._M_string_length = 0;
    local_238.m_message.field_2._M_local_buf[0] = '\0';
    local_238.m_result = false;
    local_238.m_message._M_dataplus._M_p = (pointer)paVar1;
    memset((iu_global_format_stringstream *)local_208,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_208);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_238,(AssertionResult *)"true","true","false",
               (char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffd58,
               (char *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p),
               &local_209);
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp";
    local_280._0_4_ = 0x1f;
    local_280._4_4_ = 2;
    iutest::AssertionHelper::OnFixed
              ((AssertionHelper *)&stack0xfffffffffffffd58,(Fixed *)local_208,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffd58._M_p != &local_298) {
      operator_delete(in_stack_fffffffffffffd58._M_p,local_298._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p),
                      local_58.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
    std::ios_base::~ios_base(local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_238.m_message._M_dataplus._M_p,
                      CONCAT71(local_238.m_message.field_2._M_allocated_capacity._1_7_,
                               local_238.m_message.field_2._M_local_buf[0]) + 1);
    }
    pTVar8 = iutest::TestFlag::GetInstance();
    pTVar8->m_test_flags = local_210.m_test_flags;
    local_208._8_8_ = 0;
    local_208[0x10] = '\0';
    local_208._0_8_ = pcVar2;
    iutest::detail::SPIFailureChecker::GetResult(&local_80,&local_278,(string *)local_208);
    if ((pointer)local_208._0_8_ != pcVar2) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_208._17_7_,local_208[0x10]) + 1);
    }
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
    super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (TestPartResultReporterInterface)&PTR__Collector_003a5a08;
    std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
              (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
    pTVar5 = local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
    _vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_003a2e10;
    pVVar9 = iutest::TestEnv::get_vars();
    bVar4 = local_80.m_result;
    pVVar9->m_testpartresult_reporter = pTVar5;
    if (local_80.m_result == false) {
      memset((iu_global_format_stringstream *)local_208,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,local_80.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffd58);
      local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x337568;
      local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x20000001f;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_208,false);
      if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
          super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface !=
          (TestPartResultReporterInterface)
          &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
        operator_delete((void *)local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                                super_NoTestPartResultReporter.super_TestPartResultReporterInterface
                                ._vptr_TestPartResultReporterInterface,
                        (ulong)((long)&(local_278.
                                        super_Collector<iutest::detail::NoTestPartResultReporter>.
                                        m_holder.m_origin)->_vptr_TestPartResultReporterInterface +
                               1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
      std::ios_base::~ios_base(local_188);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_message._M_dataplus._M_p != paVar3) {
      operator_delete(local_80.m_message._M_dataplus._M_p,
                      local_80.m_message.field_2._M_allocated_capacity + 1);
    }
    if (bVar4 != false) {
      iutest::detail::NewTestPartResultCheckHelper::
      Collector<iutest::detail::NoTestPartResultReporter>::Collector
                (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>);
      local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
      super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface =
           (TestPartResultReporterInterface)&PTR__Collector_003a5998;
      local_278.m_Type = kFatalFailure;
      iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_58);
      iutest::internal::NullHelper<false>::CompareEq<void>
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58._M_p);
      if (local_238.m_result == false) {
        memset((iu_global_format_stringstream *)local_208,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_208);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xfffffffffffffd58,local_238.m_message._M_dataplus._M_p,
                   (allocator<char> *)&local_210);
        local_288 = 
        "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
        ;
        local_280._0_4_ = 0x20;
        local_280._4_4_ = 2;
        iutest::AssertionHelper::OnFixed
                  ((AssertionHelper *)&stack0xfffffffffffffd58,(Fixed *)local_208,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffd58._M_p != &local_298) {
          operator_delete(in_stack_fffffffffffffd58._M_p,local_298._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
        std::ios_base::~ios_base(local_188);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_238.m_message._M_dataplus._M_p,
                        CONCAT71(local_238.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_238.m_message.field_2._M_local_buf[0]) + 1);
      }
      iVar7 = (int)local_58._M_dataplus._M_p;
      pTVar8 = iutest::TestFlag::GetInstance();
      pTVar8->m_test_flags = iVar7;
      local_208._8_8_ = 0;
      local_208[0x10] = '\0';
      local_208._0_8_ = pcVar2;
      iutest::detail::SPIFailureChecker::GetResult(&local_80,&local_278,(string *)local_208);
      if ((pointer)local_208._0_8_ != pcVar2) {
        operator_delete((void *)local_208._0_8_,CONCAT71(local_208._17_7_,local_208[0x10]) + 1);
      }
      local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
      super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface =
           (TestPartResultReporterInterface)&PTR__Collector_003a5a08;
      std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
                (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
      pTVar5 = local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin
      ;
      local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
      _vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_003a2e10;
      pVVar9 = iutest::TestEnv::get_vars();
      bVar4 = local_80.m_result;
      pVVar9->m_testpartresult_reporter = pTVar5;
      if (local_80.m_result == false) {
        memset((iu_global_format_stringstream *)local_208,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_208);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,local_80.m_message._M_dataplus._M_p,
                   (allocator<char> *)&stack0xfffffffffffffd58);
        local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x337568;
        local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x200000020;
        iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_208,false);
        if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
            super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
            _vptr_TestPartResultReporterInterface !=
            (TestPartResultReporterInterface)
            &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin)
        {
          operator_delete((void *)local_278.
                                  super_Collector<iutest::detail::NoTestPartResultReporter>.
                                  super_NoTestPartResultReporter.
                                  super_TestPartResultReporterInterface.
                                  _vptr_TestPartResultReporterInterface,
                          (ulong)((long)&(local_278.
                                          super_Collector<iutest::detail::NoTestPartResultReporter>.
                                          m_holder.m_origin)->_vptr_TestPartResultReporterInterface
                                 + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
        std::ios_base::~ios_base(local_188);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_message._M_dataplus._M_p != paVar3) {
        operator_delete(local_80.m_message._M_dataplus._M_p,
                        local_80.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar4 != false) {
        iutest::detail::NewTestPartResultCheckHelper::
        Collector<iutest::detail::NoTestPartResultReporter>::Collector
                  (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>);
        local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface =
             (TestPartResultReporterInterface)&PTR__Collector_003a5998;
        local_278.m_Type = kFatalFailure;
        iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_58);
        iutest::internal::NullHelper<false>::CompareNe<void>
                  (&local_238,"(reinterpret_cast<void*>(0))",(void *)0x0);
        if (local_238.m_result == false) {
          memset((iu_global_format_stringstream *)local_208,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_208);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffd58,local_238.m_message._M_dataplus._M_p,
                     (allocator<char> *)&local_210);
          local_288 = 
          "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
          ;
          local_280._0_4_ = 0x21;
          local_280._4_4_ = 2;
          iutest::AssertionHelper::OnFixed
                    ((AssertionHelper *)&stack0xfffffffffffffd58,(Fixed *)local_208,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffd58._M_p != &local_298) {
            operator_delete(in_stack_fffffffffffffd58._M_p,local_298._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
          std::ios_base::~ios_base(local_188);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.m_message._M_dataplus._M_p != paVar1) {
          operator_delete(local_238.m_message._M_dataplus._M_p,
                          CONCAT71(local_238.m_message.field_2._M_allocated_capacity._1_7_,
                                   local_238.m_message.field_2._M_local_buf[0]) + 1);
        }
        iVar7 = (int)local_58._M_dataplus._M_p;
        pTVar8 = iutest::TestFlag::GetInstance();
        pTVar8->m_test_flags = iVar7;
        local_208._8_8_ = 0;
        local_208[0x10] = '\0';
        local_208._0_8_ = pcVar2;
        iutest::detail::SPIFailureChecker::GetResult(&local_80,&local_278,(string *)local_208);
        if ((pointer)local_208._0_8_ != pcVar2) {
          operator_delete((void *)local_208._0_8_,CONCAT71(local_208._17_7_,local_208[0x10]) + 1);
        }
        local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface =
             (TestPartResultReporterInterface)&PTR__Collector_003a5a08;
        std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
                  (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
        pTVar5 = local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                 m_origin;
        local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
        _vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_003a2e10;
        pVVar9 = iutest::TestEnv::get_vars();
        bVar4 = local_80.m_result;
        pVVar9->m_testpartresult_reporter = pTVar5;
        if (local_80.m_result == false) {
          memset((iu_global_format_stringstream *)local_208,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_208);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,local_80.m_message._M_dataplus._M_p,
                     (allocator<char> *)&stack0xfffffffffffffd58);
          local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
          local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000021;
          iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_208,false);
          if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
              _vptr_TestPartResultReporterInterface !=
              (TestPartResultReporterInterface)
              &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin
             ) {
            operator_delete((void *)local_278.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface,
                            (ulong)((long)&(local_278.
                                            super_Collector<iutest::detail::NoTestPartResultReporter>
                                            .m_holder.m_origin)->
                                           _vptr_TestPartResultReporterInterface + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
          std::ios_base::~ios_base(local_188);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.m_message._M_dataplus._M_p != paVar3) {
          operator_delete(local_80.m_message._M_dataplus._M_p,
                          local_80.m_message.field_2._M_allocated_capacity + 1);
        }
        if (bVar4 != false) {
          iutest::detail::NewTestPartResultCheckHelper::
          Collector<iutest::detail::NoTestPartResultReporter>::Collector
                    (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>);
          local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
          super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface =
               (TestPartResultReporterInterface)&PTR__Collector_003a5998;
          local_278.m_Type = kFatalFailure;
          iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_58);
          iutest::internal::CmpHelperSame<int,int>
                    (&local_238,(internal *)0x337803,"b",(char *)&local_240->a,&local_240->b,in_R9);
          if (local_238.m_result == false) {
            memset((iu_global_format_stringstream *)local_208,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_208);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&stack0xfffffffffffffd58,local_238.m_message._M_dataplus._M_p,
                       (allocator<char> *)&local_210);
            local_288 = 
            "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
            ;
            local_280._0_4_ = 0x22;
            local_280._4_4_ = 2;
            iutest::AssertionHelper::OnFixed
                      ((AssertionHelper *)&stack0xfffffffffffffd58,(Fixed *)local_208,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffffd58._M_p != &local_298) {
              operator_delete(in_stack_fffffffffffffd58._M_p,local_298._M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
            std::ios_base::~ios_base(local_188);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238.m_message._M_dataplus._M_p != paVar1) {
            operator_delete(local_238.m_message._M_dataplus._M_p,
                            CONCAT71(local_238.m_message.field_2._M_allocated_capacity._1_7_,
                                     local_238.m_message.field_2._M_local_buf[0]) + 1);
          }
          iVar7 = (int)local_58._M_dataplus._M_p;
          pTVar8 = iutest::TestFlag::GetInstance();
          pTVar8->m_test_flags = iVar7;
          local_208._8_8_ = 0;
          local_208[0x10] = '\0';
          local_208._0_8_ = pcVar2;
          iutest::detail::SPIFailureChecker::GetResult(&local_80,&local_278,(string *)local_208);
          if ((pointer)local_208._0_8_ != pcVar2) {
            operator_delete((void *)local_208._0_8_,CONCAT71(local_208._17_7_,local_208[0x10]) + 1);
          }
          local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
          super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface =
               (TestPartResultReporterInterface)&PTR__Collector_003a5a08;
          std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
                    (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results)
          ;
          pTVar5 = local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                   m_origin;
          local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
          _vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_003a2e10;
          pVVar9 = iutest::TestEnv::get_vars();
          bVar4 = local_80.m_result;
          pVVar9->m_testpartresult_reporter = pTVar5;
          if (local_80.m_result == false) {
            memset((iu_global_format_stringstream *)local_208,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_208);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_278,local_80.m_message._M_dataplus._M_p,
                       (allocator<char> *)&stack0xfffffffffffffd58);
            local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
            super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
            local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
            super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000022;
            iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_208,false)
            ;
            if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface !=
                (TestPartResultReporterInterface)
                &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                 m_origin) {
              operator_delete((void *)local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      super_NoTestPartResultReporter.
                                      super_TestPartResultReporterInterface.
                                      _vptr_TestPartResultReporterInterface,
                              (ulong)((long)&(local_278.
                                              super_Collector<iutest::detail::NoTestPartResultReporter>
                                              .m_holder.m_origin)->
                                             _vptr_TestPartResultReporterInterface + 1));
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
            std::ios_base::~ios_base(local_188);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.m_message._M_dataplus._M_p != paVar3) {
            operator_delete(local_80.m_message._M_dataplus._M_p,
                            local_80.m_message.field_2._M_allocated_capacity + 1);
          }
          if (bVar4 != false) {
            iutest::detail::NewTestPartResultCheckHelper::
            Collector<iutest::detail::NoTestPartResultReporter>::Collector
                      (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>);
            local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
            super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
            _vptr_TestPartResultReporterInterface =
                 (TestPartResultReporterInterface)&PTR__Collector_003a5998;
            local_278.m_Type = kFatalFailure;
            iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_58);
            iutest::internal::CmpHelperMemCmpEQ<test::spi_test::TestObjectX>
                      (&local_238,"ox","oy",&local_240->ox,&local_240->oy);
            if (local_238.m_result == false) {
              memset((iu_global_format_stringstream *)local_208,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_208);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&stack0xfffffffffffffd58,local_238.m_message._M_dataplus._M_p,
                         (allocator<char> *)&local_210);
              local_288 = 
              "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
              ;
              local_280._0_4_ = 0x24;
              local_280._4_4_ = 2;
              iutest::AssertionHelper::OnFixed
                        ((AssertionHelper *)&stack0xfffffffffffffd58,(Fixed *)local_208,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffd58._M_p != &local_298) {
                operator_delete(in_stack_fffffffffffffd58._M_p,local_298._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
              std::ios_base::~ios_base(local_188);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238.m_message._M_dataplus._M_p != paVar1) {
              operator_delete(local_238.m_message._M_dataplus._M_p,
                              CONCAT71(local_238.m_message.field_2._M_allocated_capacity._1_7_,
                                       local_238.m_message.field_2._M_local_buf[0]) + 1);
            }
            pTVar8 = iutest::TestFlag::GetInstance();
            pTVar8->m_test_flags = (int)local_58._M_dataplus._M_p;
            local_208._8_8_ = 0;
            local_208[0x10] = '\0';
            local_208._0_8_ = pcVar2;
            iutest::detail::SPIFailureChecker::GetResult(&local_80,&local_278,(string *)local_208);
            if ((pointer)local_208._0_8_ != pcVar2) {
              operator_delete((void *)local_208._0_8_,CONCAT71(local_208._17_7_,local_208[0x10]) + 1
                             );
            }
            local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
            super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
            _vptr_TestPartResultReporterInterface =
                 (TestPartResultReporterInterface)&PTR__Collector_003a5a08;
            std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
                      (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                        m_results);
            pTVar5 = local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                     m_origin;
            local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
            _vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_003a2e10;
            pVVar9 = iutest::TestEnv::get_vars();
            pVVar9->m_testpartresult_reporter = pTVar5;
            if (local_80.m_result == false) {
              memset((iu_global_format_stringstream *)local_208,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_208);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_278,local_80.m_message._M_dataplus._M_p,
                         (allocator<char> *)&stack0xfffffffffffffd58);
              local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
              local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000024;
              iutest::AssertionHelper::OnFixed
                        ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
              if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                  super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface !=
                  (TestPartResultReporterInterface)
                  &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                   m_origin) {
                operator_delete((void *)local_278.
                                        super_Collector<iutest::detail::NoTestPartResultReporter>.
                                        super_NoTestPartResultReporter.
                                        super_TestPartResultReporterInterface.
                                        _vptr_TestPartResultReporterInterface,
                                (ulong)((long)&(local_278.
                                                super_Collector<iutest::detail::NoTestPartResultReporter>
                                                .m_holder.m_origin)->
                                               _vptr_TestPartResultReporterInterface + 1));
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
              std::ios_base::~ios_base(local_188);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80.m_message._M_dataplus._M_p != paVar3) {
              operator_delete(local_80.m_message._M_dataplus._M_p,
                              local_80.m_message.field_2._M_allocated_capacity + 1);
            }
            if (local_80.m_result != false) {
              ppuVar10 = (undefined **)local_240;
              FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                        ((AssertionResult *)&stack0xfffffffffffffd58,
                         (anon_class_8_1_8991fb9c *)local_240);
              bVar4 = local_288._0_1_;
              if (local_288._0_1_ == false) {
                memset((iu_global_format_stringstream *)local_208,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          ((iu_global_format_stringstream *)local_208);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                           (allocator<char> *)&local_238);
                local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000025;
                iutest::AssertionHelper::OnFixed
                          ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                    super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface !=
                    (TestPartResultReporterInterface)
                    &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                     m_origin) {
                  operator_delete((void *)local_278.
                                          super_Collector<iutest::detail::NoTestPartResultReporter>.
                                          super_NoTestPartResultReporter.
                                          super_TestPartResultReporterInterface.
                                          _vptr_TestPartResultReporterInterface,
                                  (ulong)((long)&(local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                 _vptr_TestPartResultReporterInterface + 1));
                }
                ppuVar10 = &PTR_construction_vtable_24__0039f680;
                std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                std::ios_base::~ios_base(local_188);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffffd58._M_p != &local_298) {
                ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
              }
              if (bVar4 != false) {
                FatalFailure_Sub::anon_class_1_0_00000001::operator()
                          ((AssertionResult *)&stack0xfffffffffffffd58,
                           (anon_class_1_0_00000001 *)ppuVar10);
                bVar4 = local_288._0_1_;
                if (local_288._0_1_ == false) {
                  memset((iu_global_format_stringstream *)local_208,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            ((iu_global_format_stringstream *)local_208);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                             (allocator<char> *)&local_238);
                  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000027;
                  iutest::AssertionHelper::OnFixed
                            ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                  if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                      super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                      _vptr_TestPartResultReporterInterface !=
                      (TestPartResultReporterInterface)
                      &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                       m_origin) {
                    operator_delete((void *)local_278.
                                            super_Collector<iutest::detail::NoTestPartResultReporter>
                                            .super_NoTestPartResultReporter.
                                            super_TestPartResultReporterInterface.
                                            _vptr_TestPartResultReporterInterface,
                                    (ulong)((long)&(local_278.
                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                  }
                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                  std::ios_base::~ios_base(local_188);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffd58._M_p != &local_298) {
                  ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                  operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                }
                if (bVar4 != false) {
                  FatalFailure_Sub::anon_class_1_0_00000001::operator()
                            ((AssertionResult *)&stack0xfffffffffffffd58,
                             (anon_class_1_0_00000001 *)ppuVar10);
                  bVar4 = local_288._0_1_;
                  if (local_288._0_1_ == false) {
                    memset((iu_global_format_stringstream *)local_208,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)local_208);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                               (allocator<char> *)&local_238);
                    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000028;
                    iutest::AssertionHelper::OnFixed
                              ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                    if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                        _vptr_TestPartResultReporterInterface !=
                        (TestPartResultReporterInterface)
                        &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                         m_holder.m_origin) {
                      operator_delete((void *)local_278.
                                              super_Collector<iutest::detail::NoTestPartResultReporter>
                                              .super_NoTestPartResultReporter.
                                              super_TestPartResultReporterInterface.
                                              _vptr_TestPartResultReporterInterface,
                                      (ulong)((long)&(local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                    }
                    ppuVar10 = &PTR_construction_vtable_24__0039f680;
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                    std::ios_base::~ios_base(local_188);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)in_stack_fffffffffffffd58._M_p != &local_298) {
                    ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                    operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                  }
                  if (bVar4 != false) {
                    FatalFailure_Sub::anon_class_1_0_00000001::operator()
                              ((AssertionResult *)&stack0xfffffffffffffd58,
                               (anon_class_1_0_00000001 *)ppuVar10);
                    bVar4 = local_288._0_1_;
                    if (local_288._0_1_ == false) {
                      memset((iu_global_format_stringstream *)local_208,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_208);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                 (allocator<char> *)&local_238);
                      local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                      local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000029;
                      iutest::AssertionHelper::OnFixed
                                ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                      if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                          super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                          _vptr_TestPartResultReporterInterface !=
                          (TestPartResultReporterInterface)
                          &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                           m_holder.m_origin) {
                        operator_delete((void *)local_278.
                                                super_Collector<iutest::detail::NoTestPartResultReporter>
                                                .super_NoTestPartResultReporter.
                                                super_TestPartResultReporterInterface.
                                                _vptr_TestPartResultReporterInterface,
                                        (ulong)((long)&(local_278.
                                                                                                                
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                      }
                      ppuVar10 = &PTR_construction_vtable_24__0039f680;
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                      std::ios_base::~ios_base(local_188);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)in_stack_fffffffffffffd58._M_p != &local_298) {
                      ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                      operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                    }
                    if (bVar4 != false) {
                      FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                ((AssertionResult *)&stack0xfffffffffffffd58,
                                 (anon_class_1_0_00000001 *)ppuVar10);
                      bVar4 = local_288._0_1_;
                      if (local_288._0_1_ == false) {
                        memset((iu_global_format_stringstream *)local_208,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_208);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                   (allocator<char> *)&local_238);
                        local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                        m_results.
                        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                        local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                        m_results.
                        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x20000002a;
                        iutest::AssertionHelper::OnFixed
                                  ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                        if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                            super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                            _vptr_TestPartResultReporterInterface !=
                            (TestPartResultReporterInterface)
                            &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                             m_holder.m_origin) {
                          operator_delete((void *)local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                          (ulong)((long)&(local_278.
                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                        }
                        ppuVar10 = &PTR_construction_vtable_24__0039f680;
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                        std::ios_base::~ios_base(local_188);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)in_stack_fffffffffffffd58._M_p != &local_298) {
                        ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                        operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                      }
                      if (bVar4 != false) {
                        FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                  ((AssertionResult *)&stack0xfffffffffffffd58,
                                   (anon_class_1_0_00000001 *)ppuVar10);
                        bVar4 = local_288._0_1_;
                        if (local_288._0_1_ == false) {
                          memset((iu_global_format_stringstream *)local_208,0,0x188);
                          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)local_208);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                     (allocator<char> *)&local_238);
                          local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                          m_results.
                          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                          local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                          m_results.
                          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x20000002b;
                          iutest::AssertionHelper::OnFixed
                                    ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                          if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface !=
                              (TestPartResultReporterInterface)
                              &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                               m_holder.m_origin) {
                            operator_delete((void *)local_278.
                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                            (ulong)((long)&(local_278.
                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                          }
                          ppuVar10 = &PTR_construction_vtable_24__0039f680;
                          std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                          std::ios_base::~ios_base(local_188);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)in_stack_fffffffffffffd58._M_p != &local_298) {
                          ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                          operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                        }
                        if (bVar4 != false) {
                          FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                    ((AssertionResult *)&stack0xfffffffffffffd58,
                                     (anon_class_1_0_00000001 *)ppuVar10);
                          bVar4 = local_288._0_1_;
                          if (local_288._0_1_ == false) {
                            memset((iu_global_format_stringstream *)local_208,0,0x188);
                            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)local_208);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                       (allocator<char> *)&local_238);
                            local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                            m_results.
                            super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                            local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                            m_results.
                            super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                 (pointer)0x20000002c;
                            iutest::AssertionHelper::OnFixed
                                      ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                            if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                                super_NoTestPartResultReporter.super_TestPartResultReporterInterface
                                ._vptr_TestPartResultReporterInterface !=
                                (TestPartResultReporterInterface)
                                &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>
                                 .m_holder.m_origin) {
                              operator_delete((void *)local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                              (ulong)((long)&(local_278.
                                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                            }
                            ppuVar10 = &PTR_construction_vtable_24__0039f680;
                            std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                            std::ios_base::~ios_base(local_188);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)in_stack_fffffffffffffd58._M_p != &local_298) {
                            ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                            operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                          }
                          if (bVar4 != false) {
                            FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                      ((AssertionResult *)&stack0xfffffffffffffd58,
                                       (anon_class_1_0_00000001 *)ppuVar10);
                            bVar4 = local_288._0_1_;
                            if (local_288._0_1_ == false) {
                              memset((iu_global_format_stringstream *)local_208,0,0x188);
                              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                        ((iu_global_format_stringstream *)local_208);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                         (allocator<char> *)&local_238);
                              local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              m_results.
                              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                              local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              m_results.
                              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                   (pointer)0x20000002e;
                              iutest::AssertionHelper::OnFixed
                                        ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                              if (local_278.
                                  super_Collector<iutest::detail::NoTestPartResultReporter>.
                                  super_NoTestPartResultReporter.
                                  super_TestPartResultReporterInterface.
                                  _vptr_TestPartResultReporterInterface !=
                                  (TestPartResultReporterInterface)
                                  &local_278.
                                   super_Collector<iutest::detail::NoTestPartResultReporter>.
                                   m_holder.m_origin) {
                                operator_delete((void *)local_278.
                                                                                                                
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                (ulong)((long)&(local_278.
                                                                                                                                
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                              }
                              ppuVar10 = &PTR_construction_vtable_24__0039f680;
                              std::__cxx11::stringstream::~stringstream((stringstream *)local_208);
                              std::ios_base::~ios_base(local_188);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)in_stack_fffffffffffffd58._M_p != &local_298) {
                              ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                              operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                            }
                            if (bVar4 != false) {
                              FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                        ((AssertionResult *)&stack0xfffffffffffffd58,
                                         (anon_class_1_0_00000001 *)ppuVar10);
                              bVar4 = local_288._0_1_;
                              if (local_288._0_1_ == false) {
                                memset((iu_global_format_stringstream *)local_208,0,0x188);
                                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                          ((iu_global_format_stringstream *)local_208);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                           (allocator<char> *)&local_238);
                                local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                                m_results.
                                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                                local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                                m_results.
                                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)0x20000002f;
                                iutest::AssertionHelper::OnFixed
                                          ((AssertionHelper *)&local_278,(Fixed *)local_208,false);
                                if (local_278.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface !=
                                    (TestPartResultReporterInterface)
                                    &local_278.
                                     super_Collector<iutest::detail::NoTestPartResultReporter>.
                                     m_holder.m_origin) {
                                  operator_delete((void *)local_278.
                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                }
                                std::__cxx11::stringstream::~stringstream((stringstream *)local_208)
                                ;
                                std::ios_base::~ios_base(local_188);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                operator_delete(in_stack_fffffffffffffd58._M_p,
                                                local_298._M_allocated_capacity + 1);
                              }
                              if (bVar4 != false) {
                                FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                                          ((AssertionResult *)&stack0xfffffffffffffd58,
                                           (anon_class_8_1_8991fb9c *)local_240);
                                bVar4 = local_288._0_1_;
                                if (local_288._0_1_ == false) {
                                  memset((iu_global_format_stringstream *)local_208,0,0x188);
                                  iutest::iu_global_format_stringstream::
                                  iu_global_format_stringstream
                                            ((iu_global_format_stringstream *)local_208);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                             (allocator<char> *)&local_238);
                                  local_278.
                                  super_Collector<iutest::detail::NoTestPartResultReporter>.
                                  m_results.
                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                                  local_278.
                                  super_Collector<iutest::detail::NoTestPartResultReporter>.
                                  m_results.
                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                       (pointer)0x200000030;
                                  iutest::AssertionHelper::OnFixed
                                            ((AssertionHelper *)&local_278,(Fixed *)local_208,false)
                                  ;
                                  if (local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      super_NoTestPartResultReporter.
                                      super_TestPartResultReporterInterface.
                                      _vptr_TestPartResultReporterInterface !=
                                      (TestPartResultReporterInterface)
                                      &local_278.
                                       super_Collector<iutest::detail::NoTestPartResultReporter>.
                                       m_holder.m_origin) {
                                    operator_delete((void *)local_278.
                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                  }
                                  std::__cxx11::stringstream::~stringstream
                                            ((stringstream *)local_208);
                                  std::ios_base::~ios_base(local_188);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                  operator_delete(in_stack_fffffffffffffd58._M_p,
                                                  local_298._M_allocated_capacity + 1);
                                }
                                if (bVar4 != false) {
                                  ppuVar10 = (undefined **)local_240;
                                  FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                                            ((AssertionResult *)&stack0xfffffffffffffd58,
                                             (anon_class_8_1_8991fb9c *)local_240);
                                  bVar4 = local_288._0_1_;
                                  if (local_288._0_1_ == false) {
                                    memset((iu_global_format_stringstream *)local_208,0,0x188);
                                    iutest::iu_global_format_stringstream::
                                    iu_global_format_stringstream
                                              ((iu_global_format_stringstream *)local_208);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_278,in_stack_fffffffffffffd58._M_p,
                                               (allocator<char> *)&local_238);
                                    local_278.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    m_results.
                                    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568;
                                    local_278.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    m_results.
                                    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                         (pointer)0x200000031;
                                    iutest::AssertionHelper::OnFixed
                                              ((AssertionHelper *)&local_278,(Fixed *)local_208,
                                               false);
                                    if (local_278.
                                        super_Collector<iutest::detail::NoTestPartResultReporter>.
                                        super_NoTestPartResultReporter.
                                        super_TestPartResultReporterInterface.
                                        _vptr_TestPartResultReporterInterface !=
                                        (TestPartResultReporterInterface)
                                        &local_278.
                                         super_Collector<iutest::detail::NoTestPartResultReporter>.
                                         m_holder.m_origin) {
                                      operator_delete((void *)local_278.
                                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                    }
                                    ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                    std::__cxx11::stringstream::~stringstream
                                              ((stringstream *)local_208);
                                    std::ios_base::~ios_base(local_188);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                    ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1);
                                    operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10);
                                  }
                                  if (bVar4 != false) {
                                    FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                              ((AssertionResult *)&stack0xfffffffffffffd58,
                                               (anon_class_1_0_00000001 *)ppuVar10);
                                    bVar4 = local_288._0_1_;
                                    if (local_288._0_1_ == false) {
                                      memset((iu_global_format_stringstream *)local_208,0,0x188);
                                      iutest::iu_global_format_stringstream::
                                      iu_global_format_stringstream
                                                ((iu_global_format_stringstream *)local_208);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_278,in_stack_fffffffffffffd58._M_p
                                                 ,(allocator<char> *)&local_238);
                                      local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_results.
                                      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x337568
                                      ;
                                      local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_results.
                                      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x200000032;
                                      iutest::AssertionHelper::OnFixed
                                                ((AssertionHelper *)&local_278,(Fixed *)local_208,
                                                 false);
                                      if (local_278.
                                          super_Collector<iutest::detail::NoTestPartResultReporter>.
                                          super_NoTestPartResultReporter.
                                          super_TestPartResultReporterInterface.
                                          _vptr_TestPartResultReporterInterface !=
                                          (TestPartResultReporterInterface)
                                          &local_278.
                                           super_Collector<iutest::detail::NoTestPartResultReporter>
                                           .m_holder.m_origin) {
                                        operator_delete((void *)local_278.
                                                                                                                                
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                      }
                                      ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                      std::__cxx11::stringstream::~stringstream
                                                ((stringstream *)local_208);
                                      std::ios_base::~ios_base(local_188);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                      ppuVar10 = (undefined **)(local_298._M_allocated_capacity + 1)
                                      ;
                                      operator_delete(in_stack_fffffffffffffd58._M_p,(ulong)ppuVar10
                                                     );
                                    }
                                    if (bVar4 != false) {
                                      FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                ((AssertionResult *)&stack0xfffffffffffffd58,
                                                 (anon_class_1_0_00000001 *)ppuVar10);
                                      bVar4 = local_288._0_1_;
                                      if (local_288._0_1_ == false) {
                                        memset((iu_global_format_stringstream *)local_208,0,0x188);
                                        iutest::iu_global_format_stringstream::
                                        iu_global_format_stringstream
                                                  ((iu_global_format_stringstream *)local_208);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_278,
                                                   in_stack_fffffffffffffd58._M_p,
                                                   (allocator<char> *)&local_238);
                                        local_278.
                                        super_Collector<iutest::detail::NoTestPartResultReporter>.
                                        m_results.
                                        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                        ._M_impl.super__Vector_impl_data._M_finish =
                                             (pointer)0x337568;
                                        local_278.
                                        super_Collector<iutest::detail::NoTestPartResultReporter>.
                                        m_results.
                                        super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                             (pointer)0x200000033;
                                        iutest::AssertionHelper::OnFixed
                                                  ((AssertionHelper *)&local_278,(Fixed *)local_208,
                                                   false);
                                        if (local_278.
                                            super_Collector<iutest::detail::NoTestPartResultReporter>
                                            .super_NoTestPartResultReporter.
                                            super_TestPartResultReporterInterface.
                                            _vptr_TestPartResultReporterInterface !=
                                            (TestPartResultReporterInterface)
                                            &local_278.
                                             super_Collector<iutest::detail::NoTestPartResultReporter>
                                             .m_holder.m_origin) {
                                          operator_delete((void *)local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                        }
                                        ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                        std::__cxx11::stringstream::~stringstream
                                                  ((stringstream *)local_208);
                                        std::ios_base::~ios_base(local_188);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                        ppuVar10 = (undefined **)
                                                   (local_298._M_allocated_capacity + 1);
                                        operator_delete(in_stack_fffffffffffffd58._M_p,
                                                        (ulong)ppuVar10);
                                      }
                                      if (bVar4 != false) {
                                        FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                  ((AssertionResult *)&stack0xfffffffffffffd58,
                                                   (anon_class_1_0_00000001 *)ppuVar10);
                                        bVar4 = local_288._0_1_;
                                        if (local_288._0_1_ == false) {
                                          memset((iu_global_format_stringstream *)local_208,0,0x188)
                                          ;
                                          iutest::iu_global_format_stringstream::
                                          iu_global_format_stringstream
                                                    ((iu_global_format_stringstream *)local_208);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_278,
                                                     in_stack_fffffffffffffd58._M_p,
                                                     (allocator<char> *)&local_238);
                                          local_278.
                                          super_Collector<iutest::detail::NoTestPartResultReporter>.
                                          m_results.
                                          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                          ._M_impl.super__Vector_impl_data._M_finish =
                                               (pointer)0x337568;
                                          local_278.
                                          super_Collector<iutest::detail::NoTestPartResultReporter>.
                                          m_results.
                                          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                               (pointer)0x20000003d;
                                          iutest::AssertionHelper::OnFixed
                                                    ((AssertionHelper *)&local_278,
                                                     (Fixed *)local_208,false);
                                          if (local_278.
                                              super_Collector<iutest::detail::NoTestPartResultReporter>
                                              .super_NoTestPartResultReporter.
                                              super_TestPartResultReporterInterface.
                                              _vptr_TestPartResultReporterInterface !=
                                              (TestPartResultReporterInterface)
                                              &local_278.
                                               super_Collector<iutest::detail::NoTestPartResultReporter>
                                               .m_holder.m_origin) {
                                            operator_delete((void *)local_278.
                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                          }
                                          std::__cxx11::stringstream::~stringstream
                                                    ((stringstream *)local_208);
                                          std::ios_base::~ios_base(local_188);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                          operator_delete(in_stack_fffffffffffffd58._M_p,
                                                          local_298._M_allocated_capacity + 1);
                                        }
                                        if (bVar4 != false) {
                                          ppuVar10 = (undefined **)local_240;
                                          FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                                                    ((AssertionResult *)&stack0xfffffffffffffd58,
                                                     (anon_class_8_1_8991fb9c *)local_240);
                                          bVar4 = local_288._0_1_;
                                          if (local_288._0_1_ == false) {
                                            memset((iu_global_format_stringstream *)local_208,0,
                                                   0x188);
                                            iutest::iu_global_format_stringstream::
                                            iu_global_format_stringstream
                                                      ((iu_global_format_stringstream *)local_208);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_278,
                                                       in_stack_fffffffffffffd58._M_p,
                                                       (allocator<char> *)&local_238);
                                            local_278.
                                            super_Collector<iutest::detail::NoTestPartResultReporter>
                                            .m_results.
                                            super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x337568;
                                            local_278.
                                            super_Collector<iutest::detail::NoTestPartResultReporter>
                                            .m_results.
                                            super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x20000003e;
                                            iutest::AssertionHelper::OnFixed
                                                      ((AssertionHelper *)&local_278,
                                                       (Fixed *)local_208,false);
                                            if (local_278.
                                                super_Collector<iutest::detail::NoTestPartResultReporter>
                                                .super_NoTestPartResultReporter.
                                                super_TestPartResultReporterInterface.
                                                _vptr_TestPartResultReporterInterface !=
                                                (TestPartResultReporterInterface)
                                                &local_278.
                                                 super_Collector<iutest::detail::NoTestPartResultReporter>
                                                 .m_holder.m_origin) {
                                              operator_delete((void *)local_278.
                                                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                            }
                                            ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                            std::__cxx11::stringstream::~stringstream
                                                      ((stringstream *)local_208);
                                            std::ios_base::~ios_base(local_188);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                            ppuVar10 = (undefined **)
                                                       (local_298._M_allocated_capacity + 1);
                                            operator_delete(in_stack_fffffffffffffd58._M_p,
                                                            (ulong)ppuVar10);
                                          }
                                          if (bVar4 != false) {
                                            FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                      ((AssertionResult *)&stack0xfffffffffffffd58,
                                                       (anon_class_1_0_00000001 *)ppuVar10);
                                            bVar4 = local_288._0_1_;
                                            if (local_288._0_1_ == false) {
                                              memset((iu_global_format_stringstream *)local_208,0,
                                                     0x188);
                                              iutest::iu_global_format_stringstream::
                                              iu_global_format_stringstream
                                                        ((iu_global_format_stringstream *)local_208)
                                              ;
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_278,
                                                         in_stack_fffffffffffffd58._M_p,
                                                         (allocator<char> *)&local_238);
                                              local_278.
                                              super_Collector<iutest::detail::NoTestPartResultReporter>
                                              .m_results.
                                              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                              ._M_impl.super__Vector_impl_data._M_finish =
                                                   (pointer)0x337568;
                                              local_278.
                                              super_Collector<iutest::detail::NoTestPartResultReporter>
                                              .m_results.
                                              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   (pointer)0x200000041;
                                              iutest::AssertionHelper::OnFixed
                                                        ((AssertionHelper *)&local_278,
                                                         (Fixed *)local_208,false);
                                              if (local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                operator_delete((void *)local_278.
                                                                                                                                                
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                              }
                                              ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                              std::__cxx11::stringstream::~stringstream
                                                        ((stringstream *)local_208);
                                              std::ios_base::~ios_base(local_188);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                              ppuVar10 = (undefined **)
                                                         (local_298._M_allocated_capacity + 1);
                                              operator_delete(in_stack_fffffffffffffd58._M_p,
                                                              (ulong)ppuVar10);
                                            }
                                            if (bVar4 != false) {
                                              FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                        ((AssertionResult *)&stack0xfffffffffffffd58
                                                         ,(anon_class_1_0_00000001 *)ppuVar10);
                                              bVar4 = local_288._0_1_;
                                              if (local_288._0_1_ == false) {
                                                memset((iu_global_format_stringstream *)local_208,0,
                                                       0x188);
                                                iutest::iu_global_format_stringstream::
                                                iu_global_format_stringstream
                                                          ((iu_global_format_stringstream *)
                                                           local_208);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_278,
                                                           in_stack_fffffffffffffd58._M_p,
                                                           (allocator<char> *)&local_238);
                                                local_278.
                                                super_Collector<iutest::detail::NoTestPartResultReporter>
                                                .m_results.
                                                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                ._M_impl.super__Vector_impl_data._M_finish =
                                                     (pointer)0x337568;
                                                local_278.
                                                super_Collector<iutest::detail::NoTestPartResultReporter>
                                                .m_results.
                                                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                     (pointer)0x200000042;
                                                iutest::AssertionHelper::OnFixed
                                                          ((AssertionHelper *)&local_278,
                                                           (Fixed *)local_208,false);
                                                if (local_278.
                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                  operator_delete((void *)local_278.
                                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                }
                                                ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                std::__cxx11::stringstream::~stringstream
                                                          ((stringstream *)local_208);
                                                std::ios_base::~ios_base(local_188);
                                              }
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                ppuVar10 = (undefined **)
                                                           (local_298._M_allocated_capacity + 1);
                                                operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                (ulong)ppuVar10);
                                              }
                                              if (bVar4 != false) {
                                                FatalFailure_Sub::anon_class_1_0_00000001::
                                                operator()((AssertionResult *)
                                                           &stack0xfffffffffffffd58,
                                                           (anon_class_1_0_00000001 *)ppuVar10);
                                                bVar4 = local_288._0_1_;
                                                if (local_288._0_1_ == false) {
                                                  memset((iu_global_format_stringstream *)local_208,
                                                         0,0x188);
                                                  iutest::iu_global_format_stringstream::
                                                  iu_global_format_stringstream
                                                            ((iu_global_format_stringstream *)
                                                             local_208);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_278,
                                                             in_stack_fffffffffffffd58._M_p,
                                                             (allocator<char> *)&local_238);
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000044;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                }
                                                if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                  operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                  local_298._M_allocated_capacity +
                                                                  1);
                                                }
                                                if (bVar4 != false) {
                                                  FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                  operator()((AssertionResult *)
                                                             &stack0xfffffffffffffd58,
                                                             (anon_class_8_1_8991fb9c *)local_240);
                                                  bVar4 = local_288._0_1_;
                                                  if (local_288._0_1_ == false) {
                                                    memset((iu_global_format_stringstream *)
                                                           local_208,0,0x188);
                                                    iutest::iu_global_format_stringstream::
                                                    iu_global_format_stringstream
                                                              ((iu_global_format_stringstream *)
                                                               local_208);
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_278,
                                                               in_stack_fffffffffffffd58._M_p,
                                                               (allocator<char> *)&local_238);
                                                    local_278.
                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000045;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000046;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000047;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000048;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000049;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000004a;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000004b;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000004c;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000004d;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000004e;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000004f;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000050;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000051;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000052;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000053;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000055;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000056;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000057;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000058;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000059;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000005a;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000005b;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000005c;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000005d;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000005e;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000005f;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000060;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000061;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000062;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000064;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000065;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000066;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000067;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000068;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000006a;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000073;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000074;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000075;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000077;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000079;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000007a;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000007c;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000007d;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000007e;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000080;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000082;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000083;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000084;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000086;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000088;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000008b;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000008c;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000008d;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000008e;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    ppuVar10 = (undefined **)local_240;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x20000008f;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000090;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  ppuVar10 = &PTR_construction_vtable_24__0039f680;
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    ppuVar10 = (undefined **)
                                                               (local_298._M_allocated_capacity + 1)
                                                    ;
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    (ulong)ppuVar10);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_1_0_00000001 *)ppuVar10);
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000091;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000095;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)
                                                               &stack0xfffffffffffffd58,
                                                               (anon_class_8_1_8991fb9c *)local_240)
                                                    ;
                                                    bVar4 = local_288._0_1_;
                                                    if (local_288._0_1_ == false) {
                                                      memset((iu_global_format_stringstream *)
                                                             local_208,0,0x188);
                                                      iutest::iu_global_format_stringstream::
                                                      iu_global_format_stringstream
                                                                ((iu_global_format_stringstream *)
                                                                 local_208);
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_278,
                                                                 in_stack_fffffffffffffd58._M_p,
                                                                 (allocator<char> *)&local_238);
                                                      local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x337568;
                                                  local_278.
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_results.
                                                  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x200000096;
                                                  iutest::AssertionHelper::OnFixed
                                                            ((AssertionHelper *)&local_278,
                                                             (Fixed *)local_208,false);
                                                  if (local_278.
                                                                                                            
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface !=
                                                  (TestPartResultReporterInterface)
                                                  &local_278.
                                                                                                      
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin) {
                                                    operator_delete((void *)local_278.
                                                                                                                                                        
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .super_NoTestPartResultReporter.
                                                  super_TestPartResultReporterInterface.
                                                  _vptr_TestPartResultReporterInterface,
                                                  (ulong)((long)&(local_278.
                                                                                                                                    
                                                  super_Collector<iutest::detail::NoTestPartResultReporter>
                                                  .m_holder.m_origin)->
                                                  _vptr_TestPartResultReporterInterface + 1));
                                                  }
                                                  std::__cxx11::stringstream::~stringstream
                                                            ((stringstream *)local_208);
                                                  std::ios_base::~ios_base(local_188);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)in_stack_fffffffffffffd58._M_p != &local_298) {
                                                    operator_delete(in_stack_fffffffffffffd58._M_p,
                                                                    local_298._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar4 != false) {
                                                    *local_38 = *local_38 + 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPITest::FatalFailure_Sub(int& count)
{
    #define FLAVOR(n) IUTEST_ASSERT##n
    #define FAILURE_MACRO IUTEST_ASSERT_FATAL_FAILURE

#include "spi_tests_decl.cpp"

    #undef FLAVOR
    #undef FAILURE_MACRO

    count++;
}